

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON * cJSON_AddTrueToObject(cJSON *object,char *name)

{
  cJSON_bool cVar1;
  cJSON *item;
  cJSON_bool in_R8D;
  
  item = cJSON_CreateTrue();
  cVar1 = add_item_to_object(object,name,item,(internal_hooks *)0x0,in_R8D);
  if (cVar1 == 0) {
    cJSON_Delete(item);
    item = (cJSON *)0x0;
  }
  return item;
}

Assistant:

CJSON_PUBLIC(cJSON*) cJSON_AddTrueToObject(cJSON * const object, const char * const name)
{
    cJSON *true_item = cJSON_CreateTrue();
    if (add_item_to_object(object, name, true_item, &global_hooks, false))
    {
        return true_item;
    }

    cJSON_Delete(true_item);
    return NULL;
}